

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<float> metaf::Speed::knotsToUnit(float valueKnots,Unit otherUnit)

{
  ulong uVar1;
  
  uVar1 = 0x100000000;
  switch(otherUnit) {
  case KNOTS:
    break;
  case METERS_PER_SECOND:
    valueKnots = valueKnots * 0.514444;
    break;
  case KILOMETERS_PER_HOUR:
    valueKnots = valueKnots * 1.852;
    break;
  case MILES_PER_HOUR:
    valueKnots = valueKnots * 1.150779;
    break;
  default:
    uVar1 = 0;
  }
  return (optional<float>)((uint)valueKnots | uVar1);
}

Assistant:

std::optional<float> Speed::knotsToUnit(float valueKnots, Unit otherUnit) {
	switch(otherUnit) {
		case Unit::KNOTS: 				return valueKnots;
		case Unit::METERS_PER_SECOND: 	return (valueKnots * 0.514444);
		case Unit::KILOMETERS_PER_HOUR:	return (valueKnots * 1.852);
		case Unit::MILES_PER_HOUR:		return (valueKnots * 1.150779);
		default:						return std::optional<float>();
	}
}